

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void libyuv::YPixel(uint8_t y,uint8_t *b,uint8_t *g,uint8_t *r,YuvConstants *yuvconstants)

{
  uint32_t uVar1;
  undefined1 in_CL;
  undefined7 in_register_00000009;
  undefined1 *in_RDX;
  undefined1 *in_RSI;
  uint32_t y1;
  int yg;
  int ygb;
  
  uVar1 = Clamp(0);
  *in_RSI = (char)uVar1;
  uVar1 = Clamp(0);
  *in_RDX = (char)uVar1;
  uVar1 = Clamp(0);
  *(char *)CONCAT71(in_register_00000009,in_CL) = (char)uVar1;
  return;
}

Assistant:

static __inline void YPixel(uint8_t y,
                            uint8_t* b,
                            uint8_t* g,
                            uint8_t* r,
                            const struct YuvConstants* yuvconstants) {
#if defined(__aarch64__) || defined(__arm__)
  int ygb = yuvconstants->kUVBiasBGR[3];
  int yg = yuvconstants->kYToRgb[1];
#else
  int ygb = yuvconstants->kYBiasToRgb[0];
  int yg = yuvconstants->kYToRgb[0];
#endif
  uint32_t y1 = (uint32_t)(y * 0x0101 * yg) >> 16;
  *b = Clamp(((int32_t)(y1) + ygb) >> 6);
  *g = Clamp(((int32_t)(y1) + ygb) >> 6);
  *r = Clamp(((int32_t)(y1) + ygb) >> 6);
}